

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  ulong uVar1;
  SourceLocation *pSVar2;
  pointer pSVar3;
  size_type sVar4;
  SourceLocation *pSVar5;
  long lVar6;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  pSVar2 = (SourceLocation *)detail::allocArray(capacity,8);
  *(SourceLocation *)((long)pSVar2 + lVar6) = *args;
  pSVar3 = this->data_;
  sVar4 = this->len;
  if (pSVar3 + sVar4 == pos) {
    pSVar5 = pSVar2;
    if (sVar4 != 0) {
      do {
        *pSVar5 = *pSVar3;
        pSVar3 = pSVar3 + 1;
        pSVar5 = pSVar5 + 1;
      } while (pSVar3 != pos);
    }
  }
  else {
    pSVar5 = pSVar2;
    if (pSVar3 != pos) {
      do {
        *pSVar5 = *pSVar3;
        pSVar3 = pSVar3 + 1;
        pSVar5 = pSVar5 + 1;
      } while (pSVar3 != pos);
      pSVar3 = this->data_;
      sVar4 = this->len;
    }
    if (pSVar3 + sVar4 != pos) {
      pSVar5 = (SourceLocation *)((long)pSVar2 + lVar6);
      do {
        pSVar5 = pSVar5 + 1;
        *pSVar5 = *pos;
        pos = pos + 1;
      } while (pos != pSVar3 + sVar4);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar2;
  return (pointer)((long)pSVar2 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}